

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

optional<pbrt::LightBounds> * __thiscall
pbrt::LightHandle::Bounds(optional<pbrt::LightBounds> *__return_storage_ptr__,LightHandle *this)

{
  ulong uVar1;
  uint uVar2;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          ).bits;
  uVar2 = (uint)(ushort)(uVar1 >> 0x30);
  if (uVar1 >> 0x30 < 5) {
    if (2 < uVar2) {
      if ((uVar2 & 6) == 2) {
        ProjectionLight::Bounds(__return_storage_ptr__,(ProjectionLight *)(uVar1 & 0xffffffffffff));
        return __return_storage_ptr__;
      }
      GoniometricLight::Bounds(__return_storage_ptr__,(GoniometricLight *)(uVar1 & 0xffffffffffff));
      return __return_storage_ptr__;
    }
    if (uVar2 != 2) {
      PointLight::Bounds(__return_storage_ptr__,(PointLight *)(uVar1 & 0xffffffffffff));
      return __return_storage_ptr__;
    }
  }
  else if (uVar2 - 4 < 3) {
    if (uVar2 - 4 == 2) {
      DiffuseAreaLight::Bounds(__return_storage_ptr__,(DiffuseAreaLight *)(uVar1 & 0xffffffffffff));
      return __return_storage_ptr__;
    }
    SpotLight::Bounds(__return_storage_ptr__,(SpotLight *)(uVar1 & 0xffffffffffff));
    return __return_storage_ptr__;
  }
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
  *(undefined8 *)&__return_storage_ptr__->optionalValue = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<LightBounds> LightHandle::Bounds() const {
    auto bounds = [](auto ptr) { return ptr->Bounds(); };
    return DispatchCPU(bounds);
}